

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  value_type *__x;
  ModuleDesc *pMVar1;
  pointer pFVar2;
  Result RVar3;
  Enum EVar4;
  allocator<char> local_151;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_150;
  string_view field_name_local;
  string_view module_name_local;
  string local_128;
  Location loc_1;
  string local_e8;
  Location loc;
  Var local_78;
  
  module_name_local._M_str = module_name._M_str;
  module_name_local._M_len = module_name._M_len;
  field_name_local._M_str = field_name._M_str;
  field_name_local._M_len = field_name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,sig_index,&loc_1);
  RVar3 = SharedValidator::OnFunction(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar3.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __x = pFVar2 + sig_index;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_128,&module_name_local,(allocator<char> *)&loc_1);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_e8,&field_name_local,&local_151);
    (**(code **)((long)pFVar2[sig_index].super_ExternType._vptr_ExternType + 0x10))(&local_150,__x);
    ImportType::ImportType
              ((ImportType *)&loc,&local_128,&local_e8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)&local_150);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&loc);
    ImportType::~ImportType((ImportType *)&loc);
    if (local_150._M_head_impl != (ExternType *)0x0) {
      (*(local_150._M_head_impl)->_vptr_ExternType[1])();
    }
    local_150._M_head_impl = (ExternType *)0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,__x);
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        std::string_view module_name,
                                        std::string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}